

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

string * __thiscall
vkt::shaderexecutor::FuncCaseFactory::getName_abi_cxx11_
          (string *__return_storage_ptr__,FuncCaseFactory *this)

{
  int iVar1;
  undefined4 extraout_var;
  string local_38;
  FuncCaseFactory *local_18;
  FuncCaseFactory *this_local;
  
  local_18 = this;
  this_local = (FuncCaseFactory *)__return_storage_ptr__;
  iVar1 = (*(this->super_CaseFactory)._vptr_CaseFactory[5])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))();
  de::toLower(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string						getName			(void) const { return de::toLower(getFunc().getName()); }